

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp11_define_array.hpp
# Opt level: O1

void msgpack::v1::type::
     define_array_imp<std::tuple<int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int_&>,_3UL>
     ::unpack(object *o,
             tuple<int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int_&>
             *t)

{
  object *poVar1;
  int *piVar2;
  int iVar3;
  object local_28;
  
  define_array_imp<std::tuple<int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int_&>,_2UL>
  ::unpack(o,t);
  if (2 < (o->super_object).via.array.size) {
    poVar1 = (o->super_object).via.array.ptr;
    piVar2 = (t->
             super__Tuple_impl<0UL,_int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int_&>
             ).
             super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int_&>
             .super__Tuple_impl<2UL,_int_&>.super__Head_base<2UL,_int_&,_false>._M_head_impl;
    local_28.via.array.ptr = poVar1[2].super_object.via.array.ptr;
    local_28.type = poVar1[2].super_object.type;
    local_28._4_4_ = *(undefined4 *)&poVar1[2].super_object.field_0x4;
    local_28.via.u64 = poVar1[2].super_object.via.u64;
    iVar3 = detail::convert_integer_sign<int,_true>::convert((object *)&local_28);
    *piVar2 = iVar3;
  }
  return;
}

Assistant:

static void unpack(msgpack::object const& o, Tuple& t) {
        define_array_imp<Tuple, N-1>::unpack(o, t);
        const size_t size = o.via.array.size;
        if(size <= N-1) { return; }
        convert_helper(o.via.array.ptr[N-1], std::get<N-1>(t));
    }